

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int get_response(mg_connection *conn,char *ebuf,size_t ebuf_len,int *err)

{
  int iVar1;
  longlong lVar2;
  char *local_40;
  char *endptr;
  char *cl;
  int *err_local;
  size_t ebuf_len_local;
  char *ebuf_local;
  mg_connection *conn_local;
  
  conn->connection_type = 2;
  cl = (char *)err;
  err_local = (int *)ebuf_len;
  ebuf_len_local = (size_t)ebuf;
  ebuf_local = (char *)conn;
  iVar1 = get_message(conn,ebuf,ebuf_len,err);
  if (iVar1 == 0) {
    conn_local._4_4_ = 0;
  }
  else {
    iVar1 = parse_http_response(*(char **)(ebuf_local + 0x970),*(int *)(ebuf_local + 0x990),
                                (mg_response_info *)(ebuf_local + 0x4b8));
    if (iVar1 < 1) {
      mg_snprintf((mg_connection *)ebuf_local,(int *)0x0,(char *)ebuf_len_local,(size_t)err_local,
                  "%s","Bad response");
      cl[0] = -0x70;
      cl[1] = '\x01';
      cl[2] = '\0';
      cl[3] = '\0';
      conn_local._4_4_ = 0;
    }
    else {
      endptr = get_header((mg_header *)(ebuf_local + 0x4e0),*(int *)(ebuf_local + 0x4d8),
                          "Transfer-Encoding");
      if ((endptr == (char *)0x0) || (iVar1 = mg_strcasecmp(endptr,"identity"), iVar1 == 0)) {
        endptr = get_header((mg_header *)(ebuf_local + 0x4e0),*(int *)(ebuf_local + 0x4d8),
                            "Content-Length");
        if (endptr == (char *)0x0) {
          if ((((*(int *)(ebuf_local + 0x4b8) < 100) || (199 < *(int *)(ebuf_local + 0x4b8))) &&
              (*(int *)(ebuf_local + 0x4b8) != 0xcc)) && (*(int *)(ebuf_local + 0x4b8) != 0x130)) {
            ebuf_local[0x958] = -1;
            ebuf_local[0x959] = -1;
            ebuf_local[0x95a] = -1;
            ebuf_local[0x95b] = -1;
            ebuf_local[0x95c] = -1;
            ebuf_local[0x95d] = -1;
            ebuf_local[0x95e] = -1;
            ebuf_local[0x95f] = -1;
          }
          else {
            ebuf_local[0x958] = '\0';
            ebuf_local[0x959] = '\0';
            ebuf_local[0x95a] = '\0';
            ebuf_local[0x95b] = '\0';
            ebuf_local[0x95c] = '\0';
            ebuf_local[0x95d] = '\0';
            ebuf_local[0x95e] = '\0';
            ebuf_local[0x95f] = '\0';
          }
        }
        else {
          local_40 = (char *)0x0;
          lVar2 = strtoll(endptr,&local_40,10);
          *(longlong *)(ebuf_local + 0x958) = lVar2;
          if ((local_40 == endptr) || (*(long *)(ebuf_local + 0x958) < 0)) {
            mg_snprintf((mg_connection *)ebuf_local,(int *)0x0,(char *)ebuf_len_local,
                        (size_t)err_local,"%s","Bad request");
            cl[0] = -0x65;
            cl[1] = '\x01';
            cl[2] = '\0';
            cl[3] = '\0';
            return 0;
          }
          *(undefined8 *)(ebuf_local + 0x4d0) = *(undefined8 *)(ebuf_local + 0x958);
          *(undefined8 *)(ebuf_local + 0x78) = *(undefined8 *)(ebuf_local + 0x958);
          if (*(int *)(ebuf_local + 0x4b8) == 0x130) {
            ebuf_local[0x958] = '\0';
            ebuf_local[0x959] = '\0';
            ebuf_local[0x95a] = '\0';
            ebuf_local[0x95b] = '\0';
            ebuf_local[0x95c] = '\0';
            ebuf_local[0x95d] = '\0';
            ebuf_local[0x95e] = '\0';
            ebuf_local[0x95f] = '\0';
          }
        }
      }
      else {
        iVar1 = mg_strcasecmp(endptr,"chunked");
        if (iVar1 != 0) {
          mg_snprintf((mg_connection *)ebuf_local,(int *)0x0,(char *)ebuf_len_local,
                      (size_t)err_local,"%s","Bad request");
          cl[0] = -0x70;
          cl[1] = '\x01';
          cl[2] = '\0';
          cl[3] = '\0';
          return 0;
        }
        ebuf_local[0x968] = '\x01';
        ebuf_local[0x969] = '\0';
        ebuf_local[0x96a] = '\0';
        ebuf_local[0x96b] = '\0';
        ebuf_local[0x958] = '\0';
        ebuf_local[0x959] = '\0';
        ebuf_local[0x95a] = '\0';
        ebuf_local[0x95b] = '\0';
        ebuf_local[0x95c] = '\0';
        ebuf_local[0x95d] = '\0';
        ebuf_local[0x95e] = '\0';
        ebuf_local[0x95f] = '\0';
      }
      conn_local._4_4_ = 1;
    }
  }
  return conn_local._4_4_;
}

Assistant:

static int
get_response(struct mg_connection *conn, char *ebuf, size_t ebuf_len, int *err)
{
	const char *cl;

	conn->connection_type =
	    CONNECTION_TYPE_RESPONSE; /* response (valid or not) */

	if (!get_message(conn, ebuf, ebuf_len, err)) {
		return 0;
	}

	if (parse_http_response(conn->buf, conn->buf_size, &conn->response_info)
	    <= 0) {
		mg_snprintf(conn,
		            NULL, /* No truncation check for ebuf */
		            ebuf,
		            ebuf_len,
		            "%s",
		            "Bad response");
		*err = 400;
		return 0;
	}

	/* Message is a valid response */

	if (((cl = get_header(conn->response_info.http_headers,
	                      conn->response_info.num_headers,
	                      "Transfer-Encoding"))
	     != NULL)
	    && mg_strcasecmp(cl, "identity")) {
		if (mg_strcasecmp(cl, "chunked")) {
			mg_snprintf(conn,
			            NULL, /* No truncation check for ebuf */
			            ebuf,
			            ebuf_len,
			            "%s",
			            "Bad request");
			*err = 400;
			return 0;
		}
		conn->is_chunked = 1;
		conn->content_len = 0; /* not yet read */
	} else if ((cl = get_header(conn->response_info.http_headers,
	                            conn->response_info.num_headers,
	                            "Content-Length"))
	           != NULL) {
		char *endptr = NULL;
		conn->content_len = strtoll(cl, &endptr, 10);
		if ((endptr == cl) || (conn->content_len < 0)) {
			mg_snprintf(conn,
			            NULL, /* No truncation check for ebuf */
			            ebuf,
			            ebuf_len,
			            "%s",
			            "Bad request");
			*err = 411;
			return 0;
		}
		/* Publish the content length back to the response info. */
		conn->response_info.content_length = conn->content_len;

		/* TODO: check if it is still used in response_info */
		conn->request_info.content_length = conn->content_len;

		/* TODO: we should also consider HEAD method */
		if (conn->response_info.status_code == 304) {
			conn->content_len = 0;
		}
	} else {
		/* TODO: we should also consider HEAD method */
		if (((conn->response_info.status_code >= 100)
		     && (conn->response_info.status_code <= 199))
		    || (conn->response_info.status_code == 204)
		    || (conn->response_info.status_code == 304)) {
			conn->content_len = 0;
		} else {
			conn->content_len = -1; /* unknown content length */
		}
	}

	return 1;
}